

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_linpart.cpp
# Opt level: O0

Dist * Omega_h::copies_to_linear_owners
                 (Dist *__return_storage_ptr__,CommPtr *comm,Read<long> *globals)

{
  void **this;
  LO nrroots;
  char *file;
  GO GVar1;
  Remotes local_178;
  shared_ptr<Omega_h::Comm> local_158;
  undefined1 local_141;
  Read<long> local_140;
  shared_ptr<Omega_h::Comm> local_130;
  undefined1 local_120 [8];
  Remotes copies2lins_map;
  undefined1 local_e8 [4];
  LO nlins;
  shared_ptr<Omega_h::Comm> local_d8;
  GO local_c8;
  GO total;
  allocator local_89;
  string local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [39];
  ScopedTimer local_21;
  Read<long> *pRStack_20;
  ScopedTimer omega_h_scoped_function_timer;
  Read<long> *globals_local;
  CommPtr *comm_local;
  Dist *copies2lins_dist;
  
  pRStack_20 = globals;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_linpart.cpp"
             ,&local_89);
  std::operator+(local_68,(char *)local_88);
  std::__cxx11::to_string((__cxx11 *)&total,0x36);
  std::operator+(local_48,local_68);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_21,"copies_to_linear_owners",file);
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::~string((string *)&total);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_d8,comm);
  Read<long>::Read((Read<long> *)local_e8,(Read<int> *)globals);
  GVar1 = find_total_globals(&local_d8,(Read<long> *)local_e8);
  Read<long>::~Read((Read<long> *)local_e8);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_d8);
  this = &copies2lins_map.idxs.write_.shared_alloc_.direct_ptr;
  local_c8 = GVar1;
  std::shared_ptr<Omega_h::Comm>::shared_ptr((shared_ptr<Omega_h::Comm> *)this,comm);
  nrroots = linear_partition_size((CommPtr *)this,local_c8);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr
            ((shared_ptr<Omega_h::Comm> *)&copies2lins_map.idxs.write_.shared_alloc_.direct_ptr);
  std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_130,comm);
  Read<long>::Read(&local_140,(Read<int> *)globals);
  globals_to_linear_owners((Remotes *)local_120,&local_130,&local_140,local_c8);
  Read<long>::~Read(&local_140);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_130);
  local_141 = 0;
  std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_158,comm);
  Remotes::Remotes(&local_178,(Remotes *)local_120);
  Dist::Dist(__return_storage_ptr__,&local_158,&local_178,nrroots);
  Remotes::~Remotes(&local_178);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_158);
  local_141 = 1;
  Remotes::~Remotes((Remotes *)local_120);
  ScopedTimer::~ScopedTimer(&local_21);
  return __return_storage_ptr__;
}

Assistant:

Dist copies_to_linear_owners(CommPtr comm, Read<GO> globals) {
  OMEGA_H_TIME_FUNCTION;
  auto const total = find_total_globals(comm, globals);
  auto const nlins = linear_partition_size(comm, total);
  auto const copies2lins_map = globals_to_linear_owners(comm, globals, total);
  auto const copies2lins_dist = Dist(comm, copies2lins_map, nlins);
  return copies2lins_dist;
}